

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportPdu.cpp
# Opt level: O0

void __thiscall DIS::EventReportPdu::EventReportPdu(EventReportPdu *this)

{
  EventReportPdu *this_local;
  
  SimulationManagementFamilyPdu::SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  (this->super_SimulationManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EventReportPdu_002679c0;
  this->_eventType = 0;
  this->_padding1 = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::vector(&this->_fixedDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatums);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x15');
  return;
}

Assistant:

EventReportPdu::EventReportPdu() : SimulationManagementFamilyPdu(),
   _eventType(0), 
   _padding1(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 21 );
}